

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapchecker.cpp
# Opt level: O0

void __thiscall CMapChecker::AddMaplist(CMapChecker *this,CMapVersion *pMaplist,int Num)

{
  uint uVar1;
  char *dst;
  uint in_EDX;
  CHeap *in_RSI;
  char *in_RDI;
  CWhitelistEntry *pEntry;
  int i;
  CMapChecker *in_stack_ffffffffffffffe0;
  int local_18;
  
  if ((in_RDI[0x20] & 1U) != 0) {
    Init(in_stack_ffffffffffffffe0);
  }
  for (local_18 = 0; local_18 < (int)in_EDX; local_18 = local_18 + 1) {
    dst = (char *)CHeap::Allocate(in_RSI,in_EDX);
    *(undefined8 *)(dst + 0x30) = *(undefined8 *)(in_RDI + 0x18);
    *(char **)(in_RDI + 0x18) = dst;
    str_copy(dst,in_RDI,0);
    uVar1 = bytes_be_to_uint((uchar *)(in_RSI + (long)local_18 * 6 + 1));
    *(uint *)(dst + 0x28) = uVar1;
    uVar1 = bytes_be_to_uint((uchar *)((long)&in_RSI[(long)local_18 * 6 + 1].m_pCurrent + 4));
    *(uint *)(dst + 0x2c) = uVar1;
    mem_copy(dst,in_RDI,0);
  }
  return;
}

Assistant:

void CMapChecker::AddMaplist(const CMapVersion *pMaplist, int Num)
{
	if(m_ClearListBeforeAdding)
		Init();

	for(int i = 0; i < Num; ++i)
	{
		CWhitelistEntry *pEntry = (CWhitelistEntry *)m_Whitelist.Allocate(sizeof(CWhitelistEntry));
		pEntry->m_pNext = m_pFirst;
		m_pFirst = pEntry;

		str_copy(pEntry->m_aMapName, pMaplist[i].m_aName, sizeof(pEntry->m_aMapName));
		pEntry->m_MapCrc = bytes_be_to_uint(pMaplist[i].m_aCrc);
		pEntry->m_MapSize = bytes_be_to_uint(pMaplist[i].m_aSize);
		mem_copy(&pEntry->m_MapSha256, &pMaplist[i].m_aSha256, sizeof(pEntry->m_MapSha256));
	}
}